

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aec.c
# Opt level: O2

int get_param(uint *param,int *iarg,char **argv)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  char *pcVar4;
  
  iVar1 = *iarg;
  pcVar4 = argv[iVar1];
  sVar3 = strlen(pcVar4);
  if (sVar3 == 2) {
    *iarg = iVar1 + 1;
    pcVar4 = argv[(long)iVar1 + 1];
    if (*pcVar4 == '-') {
      return 1;
    }
  }
  else {
    pcVar4 = pcVar4 + 2;
  }
  uVar2 = atoi(pcVar4);
  *param = uVar2;
  return 0;
}

Assistant:

int get_param(unsigned int *param, int *iarg, char *argv[])
{
    if (strlen(argv[*iarg]) == 2) {
        (*iarg)++;
        if (argv[*iarg][0] == '-')
            return 1;
        else
            *param = atoi(argv[*iarg]);
    } else {
        *param = atoi(&argv[*iarg][2]);
    }
    return 0;
}